

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O2

void FIX::DateTime::getYMD(int jday,int *year,int *month,int *day)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = (jday * 4 + 0x1f4b3) / 0x23ab1;
  iVar4 = (iVar1 * 0x23ab1) / -4 + jday + 0x7d2c;
  iVar2 = (iVar4 * 4 + 3) / 0x5b5;
  iVar4 = (iVar2 * 0x5b5) / -4 + iVar4;
  iVar5 = iVar4 * 5 + 2;
  iVar3 = iVar5 / 0x99;
  *day = (iVar3 * 0x99 + 2) / -5 + iVar4 + 1;
  iVar5 = iVar5 / 0x5fa;
  *month = iVar5 * -0xc + iVar3 + 3;
  *year = iVar5 + iVar1 * 100 + iVar2 + -0x12c0;
  return;
}

Assistant:

static void getYMD( int jday, int& year, int& month, int& day )
  {
    int a = jday + 32044;
    int b = (4 * a + 3) / 146097;
    int c = a - int ((b * 146097) / 4);
    int d = (4 * c + 3) / 1461;
    int e = c - int ((1461 * d) / 4);
    int m = (5 * e + 2) / 153;
    day = e - int ((153 * m + 2) / 5) + 1;
    month = m + 3 - 12 * int (m / 10);
    year = b * 100 + d - 4800 + int (m / 10);
  }